

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall cmGlobalGenerator::FillProjectMap(cmGlobalGenerator *this)

{
  iterator __position;
  bool bVar1;
  int iVar2;
  pointer ppcVar3;
  vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>> *this_00;
  cmLocalGenerator **__args;
  ulong uVar4;
  string name;
  string snpProjName;
  cmStateSnapshot snp;
  key_type local_b0;
  string local_90;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  *local_70;
  cmStateSnapshot local_68;
  cmStateSnapshot local_48;
  
  local_70 = &this->ProjectMap;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  ::clear(&local_70->_M_t);
  ppcVar3 = (this->LocalGenerators).
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppcVar3) {
    uVar4 = 0;
    do {
      cmLocalGenerator::GetStateSnapshot(&local_68,ppcVar3[uVar4]);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      local_b0._M_string_length = 0;
      local_b0.field_2._M_local_buf[0] = '\0';
      do {
        cmStateSnapshot::GetProjectName_abi_cxx11_(&local_90,&local_68);
        if (local_b0._M_string_length == local_90._M_string_length) {
          if (local_b0._M_string_length != 0) {
            iVar2 = bcmp(local_b0._M_dataplus._M_p,local_90._M_dataplus._M_p,
                         local_b0._M_string_length);
            if (iVar2 != 0) goto LAB_00294f81;
          }
        }
        else {
LAB_00294f81:
          std::__cxx11::string::_M_assign((string *)&local_b0);
          this_00 = (vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>> *)
                    std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
                    ::operator[](local_70,&local_b0);
          __args = (this->LocalGenerators).
                   super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar4;
          __position._M_current = *(cmLocalGenerator ***)(this_00 + 8);
          if (__position._M_current == *(cmLocalGenerator ***)(this_00 + 0x10)) {
            std::vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>>::
            _M_realloc_insert<cmLocalGenerator*const&>(this_00,__position,__args);
          }
          else {
            *__position._M_current = *__args;
            *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
          }
        }
        cmStateSnapshot::GetBuildsystemDirectoryParent(&local_48,&local_68);
        local_68.Position.Position = local_48.Position.Position;
        local_68.State = local_48.State;
        local_68.Position.Tree = local_48.Position.Tree;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        bVar1 = cmStateSnapshot::IsValid(&local_68);
      } while (bVar1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,
                        CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                 local_b0.field_2._M_local_buf[0]) + 1);
      }
      uVar4 = (ulong)((int)uVar4 + 1);
      ppcVar3 = (this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->LocalGenerators).
                                   super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar3 >> 3))
    ;
  }
  return;
}

Assistant:

void cmGlobalGenerator::FillProjectMap()
{
  this->ProjectMap.clear(); // make sure we start with a clean map
  unsigned int i;
  for (i = 0; i < this->LocalGenerators.size(); ++i) {
    // for each local generator add all projects
    cmStateSnapshot snp = this->LocalGenerators[i]->GetStateSnapshot();
    std::string name;
    do {
      std::string snpProjName = snp.GetProjectName();
      if (name != snpProjName) {
        name = snpProjName;
        this->ProjectMap[name].push_back(this->LocalGenerators[i]);
      }
      snp = snp.GetBuildsystemDirectoryParent();
    } while (snp.IsValid());
  }
}